

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

Result<wallet::SelectionResult> *
wallet::coinselector_tests::SelectCoinsSRD
          (CAmount *target,CoinSelectionParams *cs_params,NodeContext *m_node,
          int max_selection_weight,function<wallet::CoinsResult_(wallet::CWallet_&)> *coin_setup)

{
  initializer_list<wallet::SelectionFilter> __l;
  type params;
  type this;
  mapped_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  Groups *in_RDX;
  CWallet *in_RDI;
  CoinsResult *in_R9;
  long in_FS_OFFSET;
  Groups group;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  CoinEligibilityFilter filter;
  CoinsResult *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  CWallet *in_stack_fffffffffffffe18;
  function<wallet::CoinsResult_(wallet::CWallet_&)> *in_stack_fffffffffffffe20;
  Groups *this_01;
  CWallet *__s;
  string *in_stack_fffffffffffffe70;
  NodeContext *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffee4;
  FastRandomContext *in_stack_fffffffffffffee8;
  CAmount in_stack_fffffffffffffef0;
  CAmount in_stack_fffffffffffffef8;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *in_stack_ffffffffffffff00;
  allocator<char> local_f1 [9];
  undefined8 local_e8;
  undefined8 uStack_d7;
  undefined8 local_c8;
  undefined8 uStack_b7;
  undefined1 local_a8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __s = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RCX,(char *)__s,(allocator<char> *)in_RDI);
  NewWallet(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe08);
  std::allocator<char>::~allocator(local_f1);
  CoinEligibilityFilter::CoinEligibilityFilter
            ((CoinEligibilityFilter *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
             in_stack_fffffffffffffe10,(uint64_t)in_stack_fffffffffffffe08);
  params = std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                     ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
                      in_stack_fffffffffffffe18);
  this = std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                   ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
                    in_stack_fffffffffffffe18);
  std::function<wallet::CoinsResult_(wallet::CWallet_&)>::operator()
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  uStack_b7 = uStack_d7;
  local_c8 = local_e8;
  local_a8 = 1;
  this_01 = (Groups *)&stack0xfffffffffffffebf;
  std::allocator<wallet::SelectionFilter>::allocator
            ((allocator<wallet::SelectionFilter> *)in_stack_fffffffffffffe08);
  __l._M_len = (size_type)in_RCX;
  __l._M_array = (iterator)__s;
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
            ((vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)in_RDI,__l
             ,(allocator_type *)in_R9);
  GroupOutputs(in_RDI,in_R9,(CoinSelectionParams *)params,
               (vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)this);
  this_00 = std::
            map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
            ::operator[]((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                          *)this,(key_type *)this_01);
  Groups::Groups(this_01,in_RDX);
  std::
  map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::~map((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
          *)in_stack_fffffffffffffe08);
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::~vector
            ((vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)this_00);
  std::allocator<wallet::SelectionFilter>::~allocator
            ((allocator<wallet::SelectionFilter> *)in_stack_fffffffffffffe08);
  CoinsResult::~CoinsResult(in_stack_fffffffffffffe08);
  wallet::SelectCoinsSRD
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
  Groups::~Groups((Groups *)in_stack_fffffffffffffe08);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Result<wallet::SelectionResult> *)__s;
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<SelectionResult> SelectCoinsSRD(const CAmount& target,
                                                    const CoinSelectionParams& cs_params,
                                                    const node::NodeContext& m_node,
                                                    int max_selection_weight,
                                                    std::function<CoinsResult(CWallet&)> coin_setup)
{
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    CoinEligibilityFilter filter(0, 0, 0); // accept all coins without ancestors
    Groups group = GroupOutputs(*wallet, coin_setup(*wallet), cs_params, {{filter}})[filter].all_groups;
    return SelectCoinsSRD(group.positive_group, target, cs_params.m_change_fee, cs_params.rng_fast, max_selection_weight);
}